

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# js_generator.cc
# Opt level: O0

string * __thiscall
google::protobuf::compiler::js::(anonymous_namespace)::GetExtensionFileName_abi_cxx11_
          (string *__return_storage_ptr__,_anonymous_namespace_ *this,GeneratorOptions *options,
          FileDescriptor *file)

{
  string local_d0;
  string local_a0;
  string local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  GeneratorOptions *local_20;
  FileDescriptor *file_local;
  GeneratorOptions *options_local;
  
  local_20 = options;
  file_local = (FileDescriptor *)this;
  options_local = (GeneratorOptions *)__return_storage_ptr__;
  std::operator+(&local_60,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this
                 ,"/");
  GetFilePath_abi_cxx11_(&local_a0,(_anonymous_namespace_ *)file_local,local_20,file);
  anon_unknown_0::ToFileName(&local_80,&local_a0);
  std::operator+(&local_40,&local_60,&local_80);
  GeneratorOptions::GetFileNameExtension_abi_cxx11_(&local_d0,(GeneratorOptions *)file_local);
  std::operator+(__return_storage_ptr__,&local_40,&local_d0);
  std::__cxx11::string::~string((string *)&local_d0);
  std::__cxx11::string::~string((string *)&local_40);
  std::__cxx11::string::~string((string *)&local_80);
  std::__cxx11::string::~string((string *)&local_a0);
  std::__cxx11::string::~string((string *)&local_60);
  return __return_storage_ptr__;
}

Assistant:

string GetExtensionFileName(const GeneratorOptions& options,
                            const FileDescriptor* file) {
  return options.output_dir + "/" + ToFileName(GetFilePath(options, file)) +
         options.GetFileNameExtension();
}